

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

int __thiscall deqp::gls::TextureBufferCase::init(TextureBufferCase *this,EVP_PKEY_CTX *ctx)

{
  ScopedLogSection SVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  int extraout_EAX;
  ContextInfo *pCVar5;
  NotSupportedError *pNVar6;
  TestLog *pTVar7;
  char *pcVar8;
  ShaderProgram *pSVar9;
  TestError *pTVar10;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  ScopedLogSection local_c8;
  ScopedLogSection section_1;
  char *sectionName_1;
  TestLog *log_1;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  ScopedLogSection local_60;
  ScopedLogSection section;
  char *sectionName;
  TestLog *log;
  ApiType local_40;
  int maxTextureBufferSize;
  ApiType local_38 [4];
  ContextType local_28;
  DefaultDeleter<glu::ContextInfo> local_21;
  undefined1 local_20 [8];
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  TextureBufferCase *this_local;
  
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ = this
  ;
  pCVar5 = glu::ContextInfo::create(this->m_renderCtx);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter(&local_21);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20,pCVar5);
  local_28.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  glu::ApiType::ApiType(local_38,3,3,PROFILE_CORE);
  bVar2 = glu::contextSupports(local_28,local_38[0]);
  if (bVar2) {
LAB_0271fdb3:
    pCVar5 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        local_20);
    iVar3 = (*pCVar5->_vptr_ContextInfo[2])(pCVar5,0x8c2b);
    if (iVar3 < 1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x3cc);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    if (this->m_preRender != RENDERBITS_NONE) {
      pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      pcVar8 = "Render program";
      if (this->m_postRender != RENDERBITS_NONE) {
        pcVar8 = "Primary render program";
      }
      section.m_log = (TestLog *)pcVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar8,&local_81);
      SVar1 = section;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,(char *)SVar1.m_log,(allocator<char> *)((long)&log_1 + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_60,pTVar7,&local_80,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&log_1 + 7));
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      pSVar9 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_preRender);
      this->m_preRenderProgram = pSVar9;
      pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      glu::operator<<(pTVar7,this->m_preRenderProgram);
      do {
        dVar4 = ::deGetFalse();
        if ((dVar4 != 0) || (bVar2 = glu::ShaderProgram::isOk(this->m_preRenderProgram), !bVar2)) {
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,(char *)0x0,"m_preRenderProgram->isOk()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                     ,0x3d8);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      tcu::ScopedLogSection::~ScopedLogSection(&local_60);
    }
    if (this->m_postRender != RENDERBITS_NONE) {
      if (this->m_preRender == this->m_postRender) {
        this->m_postRenderProgram = this->m_preRenderProgram;
      }
      else {
        pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        pcVar8 = "Render program";
        if (this->m_preRender != RENDERBITS_NONE) {
          pcVar8 = "Secondary render program";
        }
        section_1.m_log = (TestLog *)pcVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar8,&local_e9);
        SVar1 = section_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,(char *)SVar1.m_log,&local_111);
        tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar7,&local_e8,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        pSVar9 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_postRender);
        this->m_postRenderProgram = pSVar9;
        pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        glu::operator<<(pTVar7,this->m_postRenderProgram);
        do {
          dVar4 = ::deGetFalse();
          if ((dVar4 != 0) || (bVar2 = glu::ShaderProgram::isOk(this->m_postRenderProgram), !bVar2))
          {
            pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar10,(char *)0x0,"m_postRenderProgram->isOk()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                       ,0x3eb);
            __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        tcu::ScopedLogSection::~ScopedLogSection(&local_c8);
      }
    }
    de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
              ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20);
    return extraout_EAX;
  }
  maxTextureBufferSize = (*this->m_renderCtx->_vptr_RenderContext[2])();
  glu::ApiType::ApiType(&local_40,3,1,PROFILE_ES);
  bVar2 = glu::contextSupports((ContextType)maxTextureBufferSize,local_40);
  if (bVar2) {
    pCVar5 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        local_20);
    bVar2 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_texture_buffer");
    if (bVar2) goto LAB_0271fdb3;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar6,"Texture buffers not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
             ,0x3c7);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureBufferCase::init (void)
{
	de::UniquePtr<glu::ContextInfo> info (glu::ContextInfo::create(m_renderCtx));

	if (!glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE))
		&& !(glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 1, glu::PROFILE_ES)) && info->isExtensionSupported("GL_EXT_texture_buffer")))
		throw tcu::NotSupportedError("Texture buffers not supported", "", __FILE__, __LINE__);

	{
		const int maxTextureBufferSize = info->getInt(GL_MAX_TEXTURE_BUFFER_SIZE);
		if (maxTextureBufferSize <= 0)
			TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");
	}

	if (m_preRender != 0)
	{
		TestLog&					log			= m_testCtx.getLog();
		const char* const			sectionName	= (m_postRender != 0 ? "Primary render program" : "Render program");
		const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

		m_preRenderProgram = createRenderProgram(m_renderCtx, m_preRender);
		m_testCtx.getLog() << (*m_preRenderProgram);

		TCU_CHECK(m_preRenderProgram->isOk());
	}

	if (m_postRender != 0)
	{
		// Reusing program
		if (m_preRender == m_postRender)
		{
			m_postRenderProgram = m_preRenderProgram;
		}
		else
		{
			TestLog&					log			= m_testCtx.getLog();
			const char* const			sectionName	= (m_preRender!= 0 ? "Secondary render program" : "Render program");
			const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

			m_postRenderProgram = createRenderProgram(m_renderCtx, m_postRender);
			m_testCtx.getLog() << (*m_postRenderProgram);

			TCU_CHECK(m_postRenderProgram->isOk());
		}
	}
}